

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

UnaryAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::optional<slang::ast::SequenceRange>&>
          (BumpAllocator *this,UnaryAssertionOperator *args,AssertionExpr *args_1,
          optional<slang::ast::SequenceRange> *args_2)

{
  UnaryAssertionOperator UVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  UnaryAssertionExpr *pUVar4;
  
  pUVar4 = (UnaryAssertionExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UnaryAssertionExpr *)this->endPtr < pUVar4 + 1) {
    pUVar4 = (UnaryAssertionExpr *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pUVar4 + 1);
  }
  UVar1 = *args;
  uVar2 = *(undefined8 *)
           &(args_2->super__Optional_base<slang::ast::SequenceRange,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRange>._M_payload;
  uVar3 = *(undefined8 *)
           ((long)&(args_2->super__Optional_base<slang::ast::SequenceRange,_true,_true>)._M_payload.
                   super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._M_value.max.
                   super__Optional_base<unsigned_int,_true,_true>._M_payload + 4);
  (pUVar4->super_AssertionExpr).kind = Unary;
  (pUVar4->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pUVar4->op = UVar1;
  pUVar4->expr = args_1;
  *(undefined8 *)
   &(pUVar4->range).super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::SequenceRange>._M_payload = uVar2;
  *(undefined8 *)
   ((long)&(pUVar4->range).super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._M_value.max.
           super__Optional_base<unsigned_int,_true,_true> + 4) = uVar3;
  return pUVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }